

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O2

uint __thiscall
llvm::DWARFVerifier::verifyNameIndexEntries(DWARFVerifier *this,NameIndex *NI,NameTableEntry *NTE)

{
  undefined1 *__return_storage_ptr__;
  DWARFContext *pDVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined4 uVar4;
  bool bVar5;
  Tag TVar6;
  int iVar7;
  storage_type *psVar8;
  unsigned_long *puVar9;
  raw_ostream *prVar10;
  uint64_t uVar11;
  DWARFUnit *pDVar12;
  DWARFContext *pDVar13;
  StringRef *pSVar14;
  Optional<unsigned_long> OVar15;
  undefined1 local_260 [8];
  Expected<llvm::DWARFDebugNames::Entry> EntryOr;
  undefined1 local_e0 [8];
  StringRef Str;
  uint64_t NextEntryID;
  SmallVector<llvm::StringRef,_2U> EntryNames;
  undefined1 auStack_90 [4];
  uint32_t CUIndex;
  iterator_range<llvm::StringRef_*> local_88;
  undefined4 local_74;
  llvm alStack_70 [4];
  uint NumEntries;
  uint64_t CUOffset;
  DWARFDie DIE;
  uint64_t EntryID;
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> local_48;
  uint64_t DIEOffset;
  undefined4 local_34 [2];
  uint NumErrors;
  
  if ((NI->Hdr).super_HeaderPOD.LocalTypeUnitCount + (NI->Hdr).super_HeaderPOD.ForeignTypeUnitCount
      != 0) {
    return 0;
  }
  local_e0 = (undefined1  [8])DWARFDebugNames::NameTableEntry::getString(NTE);
  if (local_e0 == (undefined1  [8])0x0) {
    prVar10 = error(this);
    EntryOr._184_8_ = NI->Base;
    NextEntryID = CONCAT44(NextEntryID._4_4_,NTE->Index);
    formatv<unsigned_long,_unsigned_int>
              ((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>_>_>
                *)local_260,"Name Index @ {0:x}: Unable to get string associated with name {1}.\n",
               (unsigned_long *)&EntryOr.field_0xb8,(uint *)&NextEntryID);
    raw_ostream::operator<<(prVar10,(formatv_object_base *)local_260);
    formatv_object_base::~formatv_object_base((formatv_object_base *)local_260);
    return 1;
  }
  Str.Data = (char *)strlen((char *)local_e0);
  local_34[0] = 0;
  local_74 = 0;
  Str.Length = NTE->EntryOffset;
  DIE.Die = (DWARFDebugInfoEntry *)Str.Length;
  DWARFDebugNames::NameIndex::getEntry
            ((Expected<llvm::DWARFDebugNames::Entry> *)local_260,NI,&Str.Length);
  __return_storage_ptr__ = &EntryOr.field_0xb8;
  while ((EntryOr.field_0.TStorage.buffer[0xb0] & 1U) == 0) {
    psVar8 = Expected<llvm::DWARFDebugNames::Entry>::getStorage
                       ((Expected<llvm::DWARFDebugNames::Entry> *)local_260);
    OVar15 = DWARFDebugNames::Entry::getCUIndex(psVar8);
    EntryOr._184_8_ = OVar15.Storage.field_0;
    puVar9 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                       ((OptionalStorage<unsigned_long,_true> *)__return_storage_ptr__);
    EntryNames.super_SmallVectorStorage<llvm::StringRef,_2U>.InlineElts[1].buffer._12_4_ =
         SUB84(*puVar9,0);
    if ((NI->Hdr).super_HeaderPOD.CompUnitCount <
        (uint)EntryNames.super_SmallVectorStorage<llvm::StringRef,_2U>.InlineElts[1].buffer._12_4_)
    {
      prVar10 = error(this);
      NextEntryID = NI->Base;
      formatv<unsigned_long,_unsigned_long_&,_unsigned_int_&>
                ((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>_>
                  *)__return_storage_ptr__,
                 "Name Index @ {0:x}: Entry @ {1:x} contains an invalid CU index ({2}).\n",
                 &NextEntryID,(unsigned_long *)&DIE.Die,
                 (uint *)(EntryNames.super_SmallVectorStorage<llvm::StringRef,_2U>.InlineElts[1].
                          buffer + 0xc));
      raw_ostream::operator<<(prVar10,(formatv_object_base *)__return_storage_ptr__);
LAB_00da8bce:
      formatv_object_base::~formatv_object_base((formatv_object_base *)__return_storage_ptr__);
      local_34[0] = local_34[0] + 1;
    }
    else {
      uVar11 = DWARFDebugNames::NameIndex::getCUOffset
                         (NI,EntryNames.super_SmallVectorStorage<llvm::StringRef,_2U>.InlineElts[1].
                             buffer._12_4_);
      _alStack_70 = uVar11;
      psVar8 = Expected<llvm::DWARFDebugNames::Entry>::getStorage
                         ((Expected<llvm::DWARFDebugNames::Entry> *)local_260);
      OVar15 = DWARFDebugNames::Entry::getDIEUnitOffset(psVar8);
      EntryOr._184_8_ = OVar15.Storage.field_0;
      puVar9 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                         ((OptionalStorage<unsigned_long,_true> *)__return_storage_ptr__);
      local_48._M_t.
      super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t.
      super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
      super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>,_true,_true>
            )(uVar11 + *puVar9);
      _CUOffset = (undefined1  [16])
                  DWARFContext::getDIEForOffset
                            (this->DCtx,
                             (uint64_t)
                             local_48._M_t.
                             super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>
                             .super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl);
      if (CUOffset == (DWARFUnit *)0x0 || CUOffset._8_8_ == (DWARFDebugInfoEntry *)0x0) {
        prVar10 = error(this);
        NextEntryID = NI->Base;
        formatv<unsigned_long,_unsigned_long_&,_unsigned_long_&>
                  ((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>_>
                    *)__return_storage_ptr__,
                   "Name Index @ {0:x}: Entry @ {1:x} references a non-existing DIE @ {2:x}.\n",
                   &NextEntryID,(unsigned_long *)&DIE.Die,(unsigned_long *)&local_48);
        raw_ostream::operator<<(prVar10,(formatv_object_base *)__return_storage_ptr__);
        goto LAB_00da8bce;
      }
      if ((CUOffset->Header).Offset != _alStack_70) {
        prVar10 = error(this);
        NextEntryID = NI->Base;
        local_88.begin_iterator = *(StringRef **)(CUOffset + 0x18);
        formatv<unsigned_long,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long>
                  ((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long>_>_>
                    *)__return_storage_ptr__,
                   "Name Index @ {0:x}: Entry @ {1:x}: mismatched CU of DIE @ {2:x}: index - {3:x}; debug_info - {4:x}.\n"
                   ,&NextEntryID,(unsigned_long *)&DIE.Die,(unsigned_long *)&local_48,
                   (unsigned_long *)alStack_70,(unsigned_long *)&local_88);
        raw_ostream::operator<<(prVar10,(formatv_object_base *)__return_storage_ptr__);
        formatv_object_base::~formatv_object_base((formatv_object_base *)__return_storage_ptr__);
        local_34[0] = local_34[0] + 1;
      }
      TVar6 = DWARFDie::getTag((DWARFDie *)&CUOffset);
      psVar8 = Expected<llvm::DWARFDebugNames::Entry>::getStorage
                         ((Expected<llvm::DWARFDebugNames::Entry> *)local_260);
      if (TVar6 != psVar8->Abbr->Tag) {
        prVar10 = error(this);
        NextEntryID = NI->Base;
        psVar8 = Expected<llvm::DWARFDebugNames::Entry>::getStorage
                           ((Expected<llvm::DWARFDebugNames::Entry> *)local_260);
        local_88.begin_iterator =
             (StringRef *)CONCAT62(local_88.begin_iterator._2_6_,psVar8->Abbr->Tag);
        TVar6 = DWARFDie::getTag((DWARFDie *)&CUOffset);
        DIEOffset = CONCAT62(DIEOffset._2_6_,TVar6);
        formatv<unsigned_long,_unsigned_long_&,_unsigned_long_&,_llvm::dwarf::Tag,_llvm::dwarf::Tag>
                  ((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Tag>,_llvm::detail::provider_format_adapter<llvm::dwarf::Tag>_>_>
                    *)__return_storage_ptr__,
                   "Name Index @ {0:x}: Entry @ {1:x}: mismatched Tag of DIE @ {2:x}: index - {3}; debug_info - {4}.\n"
                   ,&NextEntryID,(unsigned_long *)&DIE.Die,(unsigned_long *)&local_48,
                   (Tag *)&local_88,(Tag *)&DIEOffset);
        raw_ostream::operator<<(prVar10,(formatv_object_base *)__return_storage_ptr__);
        formatv_object_base::~formatv_object_base((formatv_object_base *)__return_storage_ptr__);
        local_34[0] = local_34[0] + 1;
      }
      getNames((SmallVector<llvm::StringRef,_2U> *)&NextEntryID,(DWARFDie *)&CUOffset,true);
      bVar5 = is_contained<llvm::SmallVector<llvm::StringRef,2u>&,llvm::StringRef>
                        ((SmallVector<llvm::StringRef,_2U> *)&NextEntryID,(StringRef *)local_e0);
      if (!bVar5) {
        prVar10 = error(this);
        DIEOffset = NI->Base;
        local_88.end_iterator =
             (StringRef *)
             (((ulong)EntryNames.super_SmallVectorImpl<llvm::StringRef>.
                      super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                      BeginX & 0xffffffff) * 0x10 + NextEntryID);
        local_88.begin_iterator = (StringRef *)NextEntryID;
        formatv<unsigned_long,_unsigned_long_&,_unsigned_long_&,_llvm::StringRef_&,_llvm::iterator_range<llvm::StringRef_*>_>
                  ((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>_>
                    *)__return_storage_ptr__,
                   "Name Index @ {0:x}: Entry @ {1:x}: mismatched Name of DIE @ {2:x}: index - {3}; debug_info - {4}.\n"
                   ,&DIEOffset,(unsigned_long *)&DIE.Die,(unsigned_long *)&local_48,
                   (StringRef *)local_e0,&local_88);
        raw_ostream::operator<<(prVar10,(formatv_object_base *)__return_storage_ptr__);
        formatv_object_base::~formatv_object_base((formatv_object_base *)__return_storage_ptr__);
        local_34[0] = local_34[0] + 1;
      }
      SmallVectorImpl<llvm::StringRef>::~SmallVectorImpl
                ((SmallVectorImpl<llvm::StringRef> *)&NextEntryID);
    }
    local_74 = local_74 + 1;
    DIE.Die = (DWARFDebugInfoEntry *)Str.Length;
    DWARFDebugNames::NameIndex::getEntry
              ((Expected<llvm::DWARFDebugNames::Entry> *)__return_storage_ptr__,NI,&Str.Length);
    Expected<llvm::DWARFDebugNames::Entry>::moveAssign<llvm::DWARFDebugNames::Entry>
              ((Expected<llvm::DWARFDebugNames::Entry> *)local_260,
               (Expected<llvm::DWARFDebugNames::Entry> *)__return_storage_ptr__);
    Expected<llvm::DWARFDebugNames::Entry>::~Expected
              ((Expected<llvm::DWARFDebugNames::Entry> *)__return_storage_ptr__);
  }
  Expected<llvm::DWARFDebugNames::Entry>::takeError
            ((Expected<llvm::DWARFDebugNames::Entry> *)auStack_90);
  uVar3 = _auStack_90;
  EntryOr._184_8_ = &local_74;
  EntryNames.super_SmallVectorStorage<llvm::StringRef,_2U>.InlineElts[0].buffer._0_8_ = local_e0;
  EntryNames.super_SmallVectorStorage<llvm::StringRef,_2U>.InlineElts[0].buffer._8_8_ = local_34;
  _auStack_90 = (char  [8])0x0;
  pDVar12 = (DWARFUnit *)(uVar3 & 0xfffffffffffffffe);
  NextEntryID = (uint64_t)this;
  EntryNames.super_SmallVectorImpl<llvm::StringRef>.
  super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX = NI;
  EntryNames.super_SmallVectorImpl<llvm::StringRef>.
  super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ = NTE;
  if (pDVar12 == (DWARFUnit *)0x0) {
    DIEOffset = 1;
  }
  else {
    iVar7 = (*pDVar12->_vptr_DWARFUnit[6])(pDVar12);
    if ((char)iVar7 == '\0') {
      CUOffset = (uint64_t)pDVar12;
      handleErrorImpl<llvm::DWARFVerifier::verifyNameIndexEntries(llvm::DWARFDebugNames::NameIndex_const&,llvm::DWARFDebugNames::NameTableEntry_const&)::__0,llvm::DWARFVerifier::verifyNameIndexEntries(llvm::DWARFDebugNames::NameIndex_const&,llvm::DWARFDebugNames::NameTableEntry_const&)::__1>
                ((llvm *)&DIEOffset,
                 (unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)
                 &CUOffset,(anon_class_48_6_0fa2c5c1 *)&EntryOr.field_0xb8,
                 (anon_class_40_5_28e94b40 *)&NextEntryID);
      pDVar12 = (DWARFUnit *)CUOffset;
      pSVar14 = (StringRef *)DIEOffset;
      if (CUOffset == 0) goto LAB_00da8df4;
    }
    else {
      pDVar1 = (DWARFContext *)pDVar12->InfoSection;
      pSVar14 = (StringRef *)0x1;
      for (pDVar13 = pDVar12->Context; pDVar13 != pDVar1;
          pDVar13 = (DWARFContext *)&(pDVar13->super_DIContext).Kind) {
        local_48._M_t.
        super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t.
        super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
        super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl =
             (__uniq_ptr_data<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>,_true,_true>
              )(pDVar13->super_DIContext)._vptr_DIContext;
        (pDVar13->super_DIContext)._vptr_DIContext = (_func_int **)0x0;
        local_88.begin_iterator = pSVar14;
        handleErrorImpl<llvm::DWARFVerifier::verifyNameIndexEntries(llvm::DWARFDebugNames::NameIndex_const&,llvm::DWARFDebugNames::NameTableEntry_const&)::__0,llvm::DWARFVerifier::verifyNameIndexEntries(llvm::DWARFDebugNames::NameIndex_const&,llvm::DWARFDebugNames::NameTableEntry_const&)::__1>
                  (alStack_70,&local_48,(anon_class_48_6_0fa2c5c1 *)&EntryOr.field_0xb8,
                   (anon_class_40_5_28e94b40 *)&NextEntryID);
        ErrorList::join((ErrorList *)&CUOffset,(Error *)&local_88,(Error *)alStack_70);
        uVar11 = CUOffset;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = DIE.U;
        _CUOffset = auVar2 << 0x40;
        if ((long *)(_alStack_70 & 0xfffffffffffffffe) != (long *)0x0) {
          (**(code **)(*(long *)(_alStack_70 & 0xfffffffffffffffe) + 8))();
        }
        if ((_Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>)
            local_48._M_t.
            super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>.
            _M_t.
            super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>
            .super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl !=
            (ErrorInfoBase *)0x0) {
          (**(code **)(*(_func_int **)
                        local_48._M_t.
                        super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>
                        .super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl + 8))();
        }
        local_48._M_t.
        super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t.
        super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
        super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl =
             (__uniq_ptr_data<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>,_true,_true>
              )(__uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>)0x0;
        if ((long *)((ulong)local_88.begin_iterator & 0xfffffffffffffffe) != (long *)0x0) {
          (**(code **)(*(long *)((ulong)local_88.begin_iterator & 0xfffffffffffffffe) + 8))();
        }
        pSVar14 = (StringRef *)(uVar11 | 1);
      }
    }
    DIEOffset = (uint64_t)pSVar14;
    (*pDVar12->_vptr_DWARFUnit[1])();
  }
LAB_00da8df4:
  cantFail((Error *)&DIEOffset,(char *)0x0);
  if ((long *)(DIEOffset & 0xfffffffffffffffe) != (long *)0x0) {
    (**(code **)(*(long *)(DIEOffset & 0xfffffffffffffffe) + 8))();
  }
  if ((long *)(_auStack_90 & 0xfffffffffffffffe) != (long *)0x0) {
    (**(code **)(*(long *)(_auStack_90 & 0xfffffffffffffffe) + 8))();
  }
  uVar4 = local_34[0];
  Expected<llvm::DWARFDebugNames::Entry>::~Expected
            ((Expected<llvm::DWARFDebugNames::Entry> *)local_260);
  return uVar4;
}

Assistant:

unsigned DWARFVerifier::verifyNameIndexEntries(
    const DWARFDebugNames::NameIndex &NI,
    const DWARFDebugNames::NameTableEntry &NTE) {
  // Verifying type unit indexes not supported.
  if (NI.getLocalTUCount() + NI.getForeignTUCount() > 0)
    return 0;

  const char *CStr = NTE.getString();
  if (!CStr) {
    error() << formatv(
        "Name Index @ {0:x}: Unable to get string associated with name {1}.\n",
        NI.getUnitOffset(), NTE.getIndex());
    return 1;
  }
  StringRef Str(CStr);

  unsigned NumErrors = 0;
  unsigned NumEntries = 0;
  uint64_t EntryID = NTE.getEntryOffset();
  uint64_t NextEntryID = EntryID;
  Expected<DWARFDebugNames::Entry> EntryOr = NI.getEntry(&NextEntryID);
  for (; EntryOr; ++NumEntries, EntryID = NextEntryID,
                                EntryOr = NI.getEntry(&NextEntryID)) {
    uint32_t CUIndex = *EntryOr->getCUIndex();
    if (CUIndex > NI.getCUCount()) {
      error() << formatv("Name Index @ {0:x}: Entry @ {1:x} contains an "
                         "invalid CU index ({2}).\n",
                         NI.getUnitOffset(), EntryID, CUIndex);
      ++NumErrors;
      continue;
    }
    uint64_t CUOffset = NI.getCUOffset(CUIndex);
    uint64_t DIEOffset = CUOffset + *EntryOr->getDIEUnitOffset();
    DWARFDie DIE = DCtx.getDIEForOffset(DIEOffset);
    if (!DIE) {
      error() << formatv("Name Index @ {0:x}: Entry @ {1:x} references a "
                         "non-existing DIE @ {2:x}.\n",
                         NI.getUnitOffset(), EntryID, DIEOffset);
      ++NumErrors;
      continue;
    }
    if (DIE.getDwarfUnit()->getOffset() != CUOffset) {
      error() << formatv("Name Index @ {0:x}: Entry @ {1:x}: mismatched CU of "
                         "DIE @ {2:x}: index - {3:x}; debug_info - {4:x}.\n",
                         NI.getUnitOffset(), EntryID, DIEOffset, CUOffset,
                         DIE.getDwarfUnit()->getOffset());
      ++NumErrors;
    }
    if (DIE.getTag() != EntryOr->tag()) {
      error() << formatv("Name Index @ {0:x}: Entry @ {1:x}: mismatched Tag of "
                         "DIE @ {2:x}: index - {3}; debug_info - {4}.\n",
                         NI.getUnitOffset(), EntryID, DIEOffset, EntryOr->tag(),
                         DIE.getTag());
      ++NumErrors;
    }

    auto EntryNames = getNames(DIE);
    if (!is_contained(EntryNames, Str)) {
      error() << formatv("Name Index @ {0:x}: Entry @ {1:x}: mismatched Name "
                         "of DIE @ {2:x}: index - {3}; debug_info - {4}.\n",
                         NI.getUnitOffset(), EntryID, DIEOffset, Str,
                         make_range(EntryNames.begin(), EntryNames.end()));
      ++NumErrors;
    }
  }
  handleAllErrors(EntryOr.takeError(),
                  [&](const DWARFDebugNames::SentinelError &) {
                    if (NumEntries > 0)
                      return;
                    error() << formatv("Name Index @ {0:x}: Name {1} ({2}) is "
                                       "not associated with any entries.\n",
                                       NI.getUnitOffset(), NTE.getIndex(), Str);
                    ++NumErrors;
                  },
                  [&](const ErrorInfoBase &Info) {
                    error()
                        << formatv("Name Index @ {0:x}: Name {1} ({2}): {3}\n",
                                   NI.getUnitOffset(), NTE.getIndex(), Str,
                                   Info.message());
                    ++NumErrors;
                  });
  return NumErrors;
}